

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_location.c
# Opt level: O0

cio_error cio_http_location_init
                    (cio_http_location *location,char *path,void *config,
                    cio_http_alloc_handler_t handler)

{
  bool bVar1;
  cio_http_alloc_handler_t handler_local;
  void *config_local;
  char *path_local;
  cio_http_location *location_local;
  
  bVar1 = true;
  if ((location != (cio_http_location *)0x0) && (bVar1 = true, path != (char *)0x0)) {
    bVar1 = handler == (cio_http_alloc_handler_t)0x0;
  }
  if (bVar1) {
    location_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    location->config = config;
    location->next = (cio_http_location *)0x0;
    location->alloc_handler = handler;
    location->path = path;
    location_local._4_4_ = CIO_SUCCESS;
  }
  return location_local._4_4_;
}

Assistant:

enum cio_error cio_http_location_init(struct cio_http_location *location, const char *path, const void *config, cio_http_alloc_handler_t handler)
{
	if (cio_unlikely((location == NULL) || (path == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	location->config = config;
	location->next = NULL;
	location->alloc_handler = handler;
	location->path = path;

	return CIO_SUCCESS;
}